

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPRequest.hpp
# Opt level: O2

void __thiscall http::detail::Socket::Socket(Socket *this,InternetProtocol internetProtocol)

{
  system_error *this_00;
  error_category *__ecat;
  int iVar1;
  
  iVar1 = getAddressFamily(internetProtocol);
  iVar1 = socket(iVar1,1,6);
  this->endpoint = iVar1;
  if (iVar1 != -1) {
    return;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  iVar1 = getLastError();
  __ecat = (error_category *)std::_V2::system_category();
  std::system_error::system_error(this_00,iVar1,__ecat,"Failed to create socket");
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

explicit Socket(InternetProtocol internetProtocol):
                endpoint(socket(getAddressFamily(internetProtocol), SOCK_STREAM, IPPROTO_TCP))
            {
                if (endpoint == invalid)
                    throw std::system_error(getLastError(), std::system_category(), "Failed to create socket");

#if defined(__APPLE__)
                const int value = 1;
                if (setsockopt(endpoint, SOL_SOCKET, SO_NOSIGPIPE, &value, sizeof(value)) == -1)
                    throw std::system_error(getLastError(), std::system_category(), "Failed to set socket option");
#endif
            }